

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O0

void __thiscall
dynamicgraph::TracerRealTime::openFile(TracerRealTime *this,SignalBase<int> *sig,string *givenname)

{
  byte bVar1;
  long lVar2;
  ofstream *this_00;
  char *pcVar3;
  ExceptionTraces *this_01;
  OutStringStream *this_02;
  OutStringStream *local_160;
  long local_158;
  OutStringStream *local_150;
  OutStringStream *newbuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  ErrorCodeEnum local_dc;
  ofstream *local_d8;
  ofstream *newfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string filename;
  undefined1 local_40 [8];
  string signame;
  string *givenname_local;
  SignalBase<int> *sig_local;
  TracerRealTime *this_local;
  
  signame.field_2._8_8_ = givenname;
  std::__cxx11::string::string((string *)local_40);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    SignalBase<int>::shortName_abi_cxx11_((string *)((long)&filename.field_2 + 8),sig);
    std::__cxx11::string::operator=
              ((string *)local_40,(string *)(filename.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::operator=((string *)local_40,(string *)signame.field_2._8_8_);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newfile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->field_0x168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->field_0x128);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newfile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->field_0x148);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&newfile);
  this_00 = (ofstream *)operator_new(0x200);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(this_00,pcVar3,_S_out);
  local_d8 = this_00;
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    if (local_d8 != (ofstream *)0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
    newbuffer._7_1_ = 1;
    this_01 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
    local_dc = NOT_OPEN;
    std::operator+(&local_140,"Could not open file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    std::operator+(&local_120,&local_140," for signal ");
    std::operator+(&local_100,&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    dynamicgraph::ExceptionTraces::ExceptionTraces(this_01,&local_dc,(string *)&local_100,"");
    newbuffer._7_1_ = 0;
    __cxa_throw(this_01,&ExceptionTraces::typeinfo,ExceptionTraces::~ExceptionTraces);
  }
  std::__cxx11::
  list<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ::push_back(&this->hardFiles,(value_type *)&local_d8);
  this_02 = (OutStringStream *)operator_new(0x1b8);
  OutStringStream::OutStringStream(this_02);
  local_158 = (long)this->bufferSize;
  local_150 = this_02;
  OutStringStream::resize(this_02,&local_158);
  std::__cxx11::string::operator=
            ((string *)
             &(local_150->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x90,(string *)signame.field_2._8_8_);
  local_160 = local_150;
  std::__cxx11::
  list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::push_back((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               *)&this->field_0x190,(value_type *)&local_160);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void TracerRealTime::openFile(const SignalBase<int> &sig,
                              const std::string &givenname) {
  dgDEBUGIN(15);
  string signame;
  if (givenname.length()) {
    signame = givenname;
  } else {
    signame = sig.shortName();
  }

  string filename = rootdir + basename + signame + suffix;
  dgDEBUG(5) << "Sig <" << sig.getName() << ">: new file " << filename << endl;
  std::ofstream *newfile = new std::ofstream(filename.c_str());
  if (!newfile->good()) {
    delete newfile;
    DG_THROW ExceptionTraces(
        ExceptionTraces::NOT_OPEN,
        "Could not open file " + filename + " for signal " + signame, "");
  }
  dgDEBUG(5) << "Newfile:" << (void *)newfile << endl;
  hardFiles.push_back(newfile);
  dgDEBUG(5) << "Creating Outstringstream" << endl;

  // std::stringstream * newbuffer = new std::stringstream ();
  OutStringStream *newbuffer = new OutStringStream();  // std::stringstream ();
  newbuffer->resize(bufferSize);
  newbuffer->givenname = givenname;
  files.push_back(newbuffer);

  dgDEBUGOUT(15);
}